

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O2

int Io_ReadDsdStrSplit(char *pCur,char **pParts,int *pTypeXor)

{
  char *pcVar1;
  byte bVar2;
  char *pCur_00;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  char *__s;
  
  if (*pCur == '\0') {
    __assert_fail("*pCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadDsd.c"
                  ,0x4c,"int Io_ReadDsdStrSplit(char *, char **, int *)");
  }
  lVar7 = 0;
  __s = "Wrong separating symbol.";
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  do {
    pParts[lVar7] = pCur;
    lVar7 = lVar7 + 1;
    pCur_00 = pCur + (*pCur == '!');
    cVar3 = pCur[*pCur == '!'];
    if (0x19 < (byte)(cVar3 + 0x9fU)) {
      while ((byte)(cVar3 - 0x30U) < 10 || (byte)(cVar3 + 0xbfU) < 6) {
        pcVar1 = pCur_00 + 1;
        pCur_00 = pCur_00 + 1;
        cVar3 = *pcVar1;
      }
      if (cVar3 != '(') {
        __s = "Cannot find the opening parenthesis.";
        goto LAB_002dda3f;
      }
      pCur_00 = Io_ReadDsdFindEnd(pCur_00);
      if (pCur_00 == (char *)0x0) {
        __s = "Cannot find the closing parenthesis.";
        goto LAB_002dda3f;
      }
    }
    bVar2 = pCur_00[1];
    if (2 < bVar2 - 0x2a) {
      if (bVar2 != 0) {
LAB_002dda3f:
        puts(__s);
      }
      if (uVar6 + uVar5 + uVar4 < 2) {
        *pTypeXor = uVar5;
      }
      else {
        puts("Different types of separating symbol ennPartsed.");
        lVar7 = 0;
      }
      return (int)lVar7;
    }
    uVar6 = uVar6 | bVar2 == 0x2a;
    uVar5 = uVar5 | bVar2 == 0x2b;
    uVar4 = uVar4 | bVar2 == 0x2c;
    pCur_00[1] = '\0';
    pCur = pCur_00 + 2;
  } while( true );
}

Assistant:

int Io_ReadDsdStrSplit( char * pCur, char * pParts[], int * pTypeXor )
{
    int fAnd = 0, fXor = 0, fPri = 0, nParts = 0;
    assert( *pCur );
    // process the parts
    while ( 1 )
    {
        // save the current part
        pParts[nParts++] = pCur;
        // skip the complement
        if ( *pCur == '!' )
            pCur++;
        // skip var
        if ( *pCur >= 'a' && *pCur <= 'z' )
            pCur++;
        else
        {
            // skip hex truth table
            while ( (*pCur >= '0' && *pCur <= '9') || (*pCur >= 'A' && *pCur <= 'F') )
                pCur++;
            // process parentheses
            if ( *pCur != '(' )
            {
                printf( "Cannot find the opening parenthesis.\n" );
                break;
            }
            // find the corresponding closing parenthesis
            pCur = Io_ReadDsdFindEnd( pCur );
            if ( pCur == NULL )
            {
                printf( "Cannot find the closing parenthesis.\n" );
                break;
            }
            pCur++;
        }
        // check the end
        if ( *pCur == 0 )
            break;
        // check symbol
        if ( *pCur != '*' && *pCur != '+' && *pCur != ',' )
        {
            printf( "Wrong separating symbol.\n" );
            break;
        }
        // remember the symbol
        fAnd |= (*pCur == '*');
        fXor |= (*pCur == '+');
        fPri |= (*pCur == ',');
        *pCur++ = 0;
    }
    // check separating symbols
    if ( fAnd + fXor + fPri > 1 )
    {
        printf( "Different types of separating symbol ennPartsed.\n" );
        return 0;
    }
    *pTypeXor = fXor;
    return nParts;
}